

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O3

void anon_unknown.dwarf_5f7ee::assert_range_equals(void)

{
  _List_node_base *p_Var1;
  initializer_list<int> __l;
  initializer_list<long> __l_00;
  vector<int,_std::allocator<int>_> v;
  list<long,_std::allocator<long>_> li;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> local_70;
  Assert local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  list<long,_std::allocator<long>_> local_38;
  
  local_58.m_file = (char *)0x100000000;
  local_58.m_line = 2;
  local_58._12_4_ = 3;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_58;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_38);
  local_48 = 2;
  uStack_40 = 3;
  local_58.m_file = (char *)0x0;
  local_58.m_line = 1;
  local_58._12_4_ = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_58;
  std::__cxx11::list<long,_std::allocator<long>_>::list(&local_38,__l_00,&local_71);
  local_58.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_58.m_line = 0x166;
  UnitTests::Assert::
  RangeEquals<std::__cxx11::list<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
            (&local_58,&local_38,&local_70);
  while (local_38.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_38) {
    p_Var1 = (((_List_base<long,_std::allocator<long>_> *)
              &(local_38.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
             _M_next;
    operator_delete(local_38.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                    super__List_node_base._M_next,0x18);
    local_38.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var1;
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(assert_range_equals)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::list<long>  li{0, 1, 2, 3};
            ASSERT_RANGE_EQUALS(li, v);
        }
        catch (UnitTests::TestFailure&)
        {
            FAIL("ASSERT_RANGE_EQUALS should not have fired here.");
        }
    }